

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.h
# Opt level: O3

void bsplib::deserial<unsigned_int>(A2A *a2a,int pid,uint *x)

{
  byte bVar1;
  pointer puVar2;
  unsigned_long uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  byte *pbVar7;
  int iVar8;
  
  lVar4 = (long)pid;
  puVar2 = (a2a->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = puVar2[lVar4];
  pbVar7 = (byte *)((a2a->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar3 + a2a->m_recv_cap * lVar4);
  *x = 0;
  iVar8 = 1;
  lVar6 = 0;
  uVar5 = 0;
  do {
    lVar6 = lVar6 + 0x100000000;
    bVar1 = *pbVar7;
    uVar5 = uVar5 + (bVar1 & 0x7f) * iVar8;
    *x = uVar5;
    iVar8 = iVar8 << 7;
    pbVar7 = pbVar7 + 1;
  } while ((char)bVar1 < '\0');
  if ((ulong)(lVar6 >> 0x20) <=
      (a2a->m_recv_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] - uVar3) {
    puVar2[lVar4] = (lVar6 >> 0x20) + uVar3;
  }
  return;
}

Assistant:

const void * recv_top( int src_pid ) const {
        std::size_t o = src_pid * m_recv_cap + m_recv_pos[src_pid];
        return static_cast< const void *>( m_recv_bufs.data() + o );
    }